

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_TEXLDL(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x03','\0');
  if (iVar1 == 0) {
    fail(ctx,"TEXLDL in version < Shader Model 3.0");
  }
  else if (ctx->source_args[1].regtype == REG_TYPE_SAMPLER) {
    if (ctx->source_args[1].regnum == 3) {
      ctx->instruction_count = ctx->instruction_count + 3;
    }
  }
  else {
    fail(ctx,"TEXLDL src1 must be sampler register");
  }
  return;
}

Assistant:

static void state_TEXLDL(Context *ctx)
{
    if (!shader_version_atleast(ctx, 3, 0))
        fail(ctx, "TEXLDL in version < Shader Model 3.0");
    else if (ctx->source_args[1].regtype != REG_TYPE_SAMPLER)
        fail(ctx, "TEXLDL src1 must be sampler register");
    else
    {
        if ( ((TextureType) ctx->source_args[1].regnum) == TEXTURE_TYPE_CUBE )
            ctx->instruction_count += 3;
    } // else
}